

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImGuiID key;
  void *pvVar1;
  
  key = ImHashStr(name,0,0);
  pvVar1 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if ((pvVar1 != (void *)0x0) && ((cond == 0 || ((*(char *)((long)pvVar1 + 0xf2) & cond) != 0)))) {
    *(byte *)((long)pvVar1 + 0xf2) = *(byte *)((long)pvVar1 + 0xf2) & 0xf1;
    *(bool *)((long)pvVar1 + 0xce) = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}